

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomSignalPdu.cpp
# Opt level: O0

bool __thiscall DIS::IntercomSignalPdu::operator==(IntercomSignalPdu *this,IntercomSignalPdu *rhs)

{
  value_type vVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  IntercomSignalPdu *rhs_local;
  IntercomSignalPdu *this_local;
  
  idx._7_1_ = RadioCommunicationsFamilyPdu::operator==
                        (&this->super_RadioCommunicationsFamilyPdu,
                         &rhs->super_RadioCommunicationsFamilyPdu);
  bVar2 = EntityID::operator==(&this->_entityID,&rhs->_entityID);
  if (!bVar2) {
    idx._7_1_ = false;
  }
  if (this->_communicationsDeviceID != rhs->_communicationsDeviceID) {
    idx._7_1_ = false;
  }
  if (this->_encodingScheme != rhs->_encodingScheme) {
    idx._7_1_ = false;
  }
  if (this->_tdlType != rhs->_tdlType) {
    idx._7_1_ = false;
  }
  if (this->_sampleRate != rhs->_sampleRate) {
    idx._7_1_ = false;
  }
  if (this->_samples != rhs->_samples) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_data);
    if (sVar3 <= local_28) break;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&this->_data,local_28);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&rhs->_data,local_28);
    if (vVar1 != *pvVar4) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool IntercomSignalPdu::operator==(const IntercomSignalPdu &rhs) const {
  bool ivarsEqual = true;

  ivarsEqual = RadioCommunicationsFamilyPdu::operator==(rhs);

  if (!(_entityID == rhs._entityID))
    ivarsEqual = false;
  if (!(_communicationsDeviceID == rhs._communicationsDeviceID))
    ivarsEqual = false;
  if (!(_encodingScheme == rhs._encodingScheme))
    ivarsEqual = false;
  if (!(_tdlType == rhs._tdlType))
    ivarsEqual = false;
  if (!(_sampleRate == rhs._sampleRate))
    ivarsEqual = false;
  if (!(_samples == rhs._samples))
    ivarsEqual = false;

  for (size_t idx = 0; idx < _data.size(); idx++) {
    if (!(_data[idx] == rhs._data[idx]))
      ivarsEqual = false;
  }

  return ivarsEqual;
}